

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter.cpp
# Opt level: O0

void __thiscall E64::blitter_ic::io_write_8(blitter_ic *this,uint16_t address,uint8_t byte)

{
  byte in_DL;
  undefined1 in_SIL;
  blitter_ic *in_RDI;
  
  switch(in_SIL) {
  case 0:
    break;
  case 1:
    break;
  case 2:
    if ((in_DL & 1) != 0) {
      add_operation_clear_framebuffer(in_RDI);
    }
    if ((in_DL & 2) != 0) {
      add_operation_draw_hor_border(in_RDI);
    }
    if ((in_DL & 4) != 0) {
      add_operation_draw_ver_border(in_RDI);
    }
    break;
  case 3:
    in_RDI->blitter_context_ptr_no = in_DL;
    break;
  default:
    break;
  case 9:
    in_RDI->hor_border_size = (ushort)in_DL;
    if (in_RDI->scanlines / 2 < (uint)in_RDI->hor_border_size) {
      in_RDI->hor_border_size = in_RDI->scanlines / 2;
    }
    break;
  case 10:
    in_RDI->ver_border_size = in_RDI->ver_border_size & 0xff | (ushort)in_DL << 8;
    if (in_RDI->pixels_per_scanline / 2 < (uint)in_RDI->ver_border_size) {
      in_RDI->ver_border_size = in_RDI->pixels_per_scanline / 2;
    }
    break;
  case 0xb:
    in_RDI->ver_border_size = in_RDI->ver_border_size & 0xff00 | (ushort)in_DL;
    if (in_RDI->pixels_per_scanline / 2 < (uint)in_RDI->ver_border_size) {
      in_RDI->ver_border_size = in_RDI->pixels_per_scanline / 2;
    }
    break;
  case 0xc:
    in_RDI->hor_border_color = in_RDI->hor_border_color & 0xff | (ushort)in_DL << 8;
    break;
  case 0xd:
    in_RDI->hor_border_color = in_RDI->hor_border_color & 0xff00 | (ushort)in_DL;
    break;
  case 0xe:
    in_RDI->ver_border_color = in_RDI->ver_border_color & 0xff | (ushort)in_DL << 8;
    break;
  case 0xf:
    in_RDI->ver_border_color = in_RDI->ver_border_color & 0xff00 | (ushort)in_DL;
    break;
  case 0x10:
    in_RDI->clear_color = in_RDI->clear_color & 0xff | (ushort)in_DL << 8;
    break;
  case 0x11:
    in_RDI->clear_color = in_RDI->clear_color & 0xff00 | (ushort)in_DL;
    break;
  case 0x12:
    set_current_blitter_width(in_RDI,in_DL);
    break;
  case 0x13:
    set_current_blitter_height(in_RDI,in_DL);
  }
  return;
}

Assistant:

void E64::blitter_ic::io_write_8(uint16_t address, uint8_t byte)
{
	
	switch (address & 0xff) {
		case BLITTER_SR:
//			if ((byte & 0b00000001) && pending_screenrefresh_irq) {
//				pending_screenrefresh_irq = false;
//				if (exceptions_connected) {
//					TTL74LS148->release_line(interrupt_device_no);
//				}
//			}
			break;
		case BLITTER_CR:
//			if (byte & 0b00000001) {
//				generate_screenrefresh_irq = true;
//			} else {
//				generate_screenrefresh_irq = false;
//			}
			break;
		case BLITTER_OPERATION:
			if (byte & 0b00000001) add_operation_clear_framebuffer();
			if (byte & 0b00000010) add_operation_draw_hor_border();
			if (byte & 0b00000100) add_operation_draw_ver_border();
			break;
		case BLITTER_CONTEXT_PTR_NO:
			blitter_context_ptr_no = byte;
			break;
		case BLITTER_HOR_BORDER_SIZE+1:
			hor_border_size = byte;
			if (hor_border_size > (scanlines / 2)) {
				hor_border_size = (scanlines / 2);
			}
			break;
		case BLITTER_VER_BORDER_SIZE:
			ver_border_size = (ver_border_size & 0x00ff) | (byte << 8);
			if (ver_border_size > (pixels_per_scanline / 2)) {
				ver_border_size = (pixels_per_scanline / 2);
			}
			break;
		case BLITTER_VER_BORDER_SIZE+1:
			ver_border_size = (ver_border_size & 0xff00) | byte;
			if (ver_border_size > (pixels_per_scanline / 2)) {
				ver_border_size = (pixels_per_scanline / 2);
			}
			break;
		case BLITTER_HOR_BORDER_COLOR:
			hor_border_color = (hor_border_color & 0x00ff) | (byte << 8);
			break;
		case BLITTER_HOR_BORDER_COLOR+1:
			hor_border_color = (hor_border_color & 0xff00) | byte;
			break;
		case BLITTER_VER_BORDER_COLOR:
			ver_border_color = (ver_border_color & 0x00ff) | (byte << 8);
			break;
		case BLITTER_VER_BORDER_COLOR+1:
			ver_border_color = (ver_border_color & 0xff00) | byte;
			break;
		case BLITTER_CLEAR_COLOR:
			clear_color = (clear_color & 0x00ff) | (byte << 8);
			break;
		case BLITTER_CLEAR_COLOR+1:
			clear_color = (clear_color & 0xff00) | byte;
			break;
		case BLITTER_SCREEN_WIDTH:
			set_current_blitter_width(byte);
			break;
		case BLITTER_SCREEN_HEIGHT:
			set_current_blitter_height(byte);
			break;
		default:
			break;
	}
}